

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_node_effects.cpp
# Opt level: O0

void __thiscall
PixelDist_GradApply4Radial::getPixel
          (PixelDist_GradApply4Radial *this,uchar *data,Pixel *p,int x,int y)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  ImageData *this_00;
  uchar *data_00;
  fe_image *im;
  int a2;
  int a1;
  int gx;
  PixDist *pp;
  fe_image *image;
  Pixel g;
  PixelR8G8B8A8 gp;
  int y_local;
  int x_local;
  Pixel *p_local;
  uchar *data_local;
  PixelDist_GradApply4Radial *this_local;
  
  im = &(this->grad).image;
  a2 = (int)((*(float *)data + this->radOuter) * this->distScale);
  if (im->w <= a2) {
    a2 = im->w + -1;
  }
  if (a2 < 0) {
    a2 = 0;
  }
  g.field_0 = (anon_union_4_3_3c41bd51_for_Pixel_0)y;
  this_00 = asImage(im);
  data_00 = fe::ImageData::getPixelPtr(this_00,a2,0);
  fe::PixelR8G8B8A8::getPixel
            ((PixelR8G8B8A8 *)((long)&image + 7),data_00,(Pixel *)&image,x,(int)g.field_0);
  iVar2 = getAlphaRadOpt(-*(float *)data,this->radSharpOuter,1.0);
  iVar3 = getAlphaRadOpt(*(float *)data,this->radSharpInner,1.0);
  (p->field_0).field_0.bytes[0] = (uchar)image;
  (p->field_0).field_0.bytes[1] = image._1_1_;
  (p->field_0).field_0.bytes[2] = image._2_1_;
  uVar1 = (long)(int)((uint)image._3_1_ * iVar2 * iVar3) / 0xff;
  (p->field_0).field_0.bytes[3] =
       (uchar)((long)((ulong)(uint)((int)uVar1 >> 0x1f) << 0x20 | uVar1 & 0xffffffff) / 0xff);
  return;
}

Assistant:

void getPixel(GET_PIXEL_ARGS) const
    {
        PixelR8G8B8A8 gp;
        Pixel g;

        const fe_image& image = grad.image;

        const PixDist* pp = (PixDist*)data;

        int gx = int((pp->d1 + radOuter) * distScale);
        if (gx >= image.w)
            gx = image.w - 1;
        if (gx < 0)
            gx = 0;

        gp.getPixel(asImage(&image)->getPixelPtr(gx, 0), g, OPERATOR_ARGS_PASS);
        int a1 = getAlphaRadOpt(-pp->d1, radSharpOuter, 1.0f);
        int a2 = getAlphaRadOpt(pp->d1, radSharpInner, 1.0f);

        p.r = g.r;
        p.g = g.g;
        p.b = g.b;

        p.a = g.a * a1  * a2 / 255 / 255;
    }